

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

string_view __thiscall inja::Lexer::clear_final_line_if_whitespace(Lexer *this,string_view text)

{
  char cVar1;
  string_view sVar2;
  bool bVar3;
  const_reference pvVar4;
  undefined1 auStack_38 [7];
  char ch;
  string_view result;
  string_view text_local;
  char *local_10;
  
  local_10 = (char *)text._M_len;
  _auStack_38 = this;
  result._M_len = (size_t)local_10;
  result._M_str = (char *)this;
  do {
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_38);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
LAB_00118329:
      text_local._M_str = (char *)_auStack_38;
      local_10 = (char *)result._M_len;
LAB_00118339:
      sVar2._M_str = local_10;
      sVar2._M_len = (size_t)text_local._M_str;
      return sVar2;
    }
    pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::back
                       ((basic_string_view<char,_std::char_traits<char>_> *)auStack_38);
    cVar1 = *pvVar4;
    if ((cVar1 != ' ') && (cVar1 != '\t')) {
      if ((cVar1 != '\n') && (cVar1 != '\r')) {
        text_local._M_str = result._M_str;
        goto LAB_00118339;
      }
      goto LAB_00118329;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_38,1);
  } while( true );
}

Assistant:

static nonstd::string_view clear_final_line_if_whitespace(nonstd::string_view text)
  {
    nonstd::string_view result = text;
    while (!result.empty()) {
      char ch = result.back();
      if (ch == ' ' || ch == '\t')
       result.remove_suffix(1);
      else if (ch == '\n' || ch == '\r')
        break;
      else
        return text;
    }
    return result;
  }